

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledRgbaInputFile::setFrameBuffer
          (TiledRgbaInputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  long in_RCX;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  FrameBuffer fb;
  size_t ys;
  size_t xs;
  Lock lock;
  FrameBuffer *in_stack_000002d8;
  TiledInputFile *in_stack_000002e0;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe0c;
  Lock *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  string local_1a8 [32];
  Slice local_188;
  string local_150 [32];
  Slice local_130;
  string local_f8 [8];
  string *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  Rgba *in_stack_ffffffffffffff28;
  FromYa *in_stack_ffffffffffffff30;
  string local_a0 [80];
  size_t local_50;
  size_t local_48;
  char *local_10;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_48 = in_RDX << 3;
    local_50 = in_RCX << 3;
    local_10 = in_RSI;
    FrameBuffer::FrameBuffer((FrameBuffer *)0x2b84bf);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice((Slice *)&stack0xffffffffffffff28,HALF,local_10,local_48,local_50,1,1,0.0,false,
                 false);
    FrameBuffer::insert((FrameBuffer *)in_stack_fffffffffffffe10,
                        (string *)CONCAT44(in_stack_fffffffffffffe0c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe04,uVar1));
    std::__cxx11::string::~string(local_a0);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice(&local_130,HALF,local_10 + 2,local_48,local_50,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)in_stack_fffffffffffffe10,
                        (string *)CONCAT44(in_stack_fffffffffffffe0c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe04,uVar1));
    std::__cxx11::string::~string(local_f8);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice(&local_188,HALF,local_10 + 4,local_48,local_50,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)in_stack_fffffffffffffe10,
                        (string *)CONCAT44(in_stack_fffffffffffffe0c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe04,uVar1));
    std::__cxx11::string::~string(local_150);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice((Slice *)&stack0xfffffffffffffe20,HALF,local_10 + 6,local_48,local_50,1,1,1.0,false
                 ,false);
    FrameBuffer::insert((FrameBuffer *)in_stack_fffffffffffffe10,
                        (string *)CONCAT44(in_stack_fffffffffffffe0c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe04,uVar1));
    std::__cxx11::string::~string(local_1a8);
    TiledInputFile::setFrameBuffer(in_stack_000002e0,in_stack_000002d8);
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x2b873a);
  }
  else {
    IlmThread_2_5::Lock::Lock
              (in_stack_fffffffffffffe10,
               (Mutex *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               SUB41((uint)in_stack_fffffffffffffe04 >> 0x18,0));
    FromYa::setFrameBuffer
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  return;
}

Assistant:

void	
TiledRgbaInputFile::setFrameBuffer (Rgba *base, size_t xStride, size_t yStride)
{
    if (_fromYa)
    {
	Lock lock (*_fromYa);
	_fromYa->setFrameBuffer (base, xStride, yStride, _channelNamePrefix);
    }
    else
    {
	size_t xs = xStride * sizeof (Rgba);
	size_t ys = yStride * sizeof (Rgba);

	FrameBuffer fb;

	fb.insert (_channelNamePrefix + "R",
		   Slice (HALF,
			       (char *) &base[0].r,
			       xs, ys,
			       1, 1,	// xSampling, ySampling
			       0.0));	// fillValue

	fb.insert (_channelNamePrefix + "G",
		   Slice (HALF,
			       (char *) &base[0].g,
			       xs, ys,
			       1, 1,	// xSampling, ySampling
			       0.0));	// fillValue

	fb.insert (_channelNamePrefix + "B",
		   Slice (HALF,
			       (char *) &base[0].b,
			       xs, ys,
			       1, 1,	// xSampling, ySampling
			       0.0));	// fillValue

	fb.insert (_channelNamePrefix + "A",
		   Slice (HALF,
			       (char *) &base[0].a,
			       xs, ys,
			       1, 1,	// xSampling, ySampling
			       1.0));	// fillValue

	_inputFile->setFrameBuffer (fb);
    }
}